

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O0

add_torrent_params * __thiscall
libtorrent::load_torrent_buffer
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          load_torrent_limits *cfg)

{
  shared_ptr<libtorrent::torrent_info> local_60 [2];
  undefined1 local_39;
  undefined1 local_38 [8];
  shared_ptr<libtorrent::torrent_info> ti;
  load_torrent_limits *cfg_local;
  span<const_char> buffer_local;
  add_torrent_params *ret;
  
  ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buffer.m_len;
  buffer_local.m_ptr = buffer.m_ptr;
  cfg_local = (load_torrent_limits *)this;
  buffer_local.m_len = (difference_type)__return_storage_ptr__;
  ::std::
  make_shared<libtorrent::torrent_info,libtorrent::span<char_const>&,libtorrent::load_torrent_limits_const&,libtorrent::from_span_t&>
            ((span<const_char> *)local_38,(load_torrent_limits *)&cfg_local,
             (from_span_t *)
             ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi);
  local_39 = 0;
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr
            (local_60,(shared_ptr<libtorrent::torrent_info> *)local_38);
  anon_unknown_25::update_atp(local_60,__return_storage_ptr__);
  ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr(local_60);
  local_39 = 1;
  ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
            ((shared_ptr<libtorrent::torrent_info> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params load_torrent_buffer(span<char const> buffer, load_torrent_limits const& cfg)
	{
		auto ti = std::make_shared<torrent_info>(buffer, cfg, from_span);
		add_torrent_params ret;
		update_atp(std::move(ti), ret);
		return ret;
	}